

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

char * alboolString(ALCboolean x)

{
  char *pcStack_10;
  ALCboolean x_local;
  
  if (x == '\0') {
    pcStack_10 = "AL_FALSE";
  }
  else if (x == '\x01') {
    pcStack_10 = "AL_TRUE";
  }
  else {
    pcStack_10 = sprintf_alloc("0x%X",(ulong)(uint)(int)x);
  }
  return pcStack_10;
}

Assistant:

const char *alboolString(const ALCboolean x)
{
    switch (x) {
        case AL_TRUE: return "AL_TRUE";
        case AL_FALSE: return "AL_FALSE";
        default: break;
    }

    return sprintf_alloc("0x%X", (uint) x);
}